

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addData
          (_Variant_storage<false,wasm::Ok,wasm::Err> *__return_storage_ptr__,ParseDefsCtx *this,
          undefined8 param_3,undefined8 param_4,undefined4 *mem,uint param_6,undefined8 offset,
          char param_8)

{
  uint uVar1;
  Module *pMVar2;
  pointer puVar3;
  __uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> _Var4;
  pointer puVar5;
  Memory *pMVar6;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  string local_70;
  Err local_50;
  allocator<char> local_29;
  
  pMVar2 = this->wasm;
  uVar1 = this->index;
  puVar3 = (pMVar2->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var4._M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
       puVar3[uVar1]._M_t.
       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
  if (param_8 == '\x01') {
    *(undefined1 *)
     ((long)_Var4._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x28) = 0;
    *(undefined8 *)
     ((long)_Var4._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x30) = offset;
    if (mem == (undefined4 *)0x0) {
      puVar5 = (pMVar2->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar2->memories).
          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == puVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"active data segment with no memory",&local_29);
        Lexer::err(&local_50,&this->in,(ulong)param_6,&local_70);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>(__return_storage_ptr__,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        return (Result<wasm::Ok> *)__return_storage_ptr__;
      }
      pMVar6 = (puVar5->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      _Var7._M_head_impl =
           *(DataSegment **)
            &puVar3[uVar1]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
      uVar8 = *(undefined4 *)&(pMVar6->super_Importable).super_Named;
      uVar9 = *(undefined4 *)((long)&(pMVar6->super_Importable).super_Named + 4);
      uVar10 = *(undefined4 *)((long)&(pMVar6->super_Importable).super_Named + 8);
      uVar11 = *(undefined4 *)((long)&(pMVar6->super_Importable).super_Named + 0xc);
    }
    else {
      _Var7._M_head_impl =
           *(DataSegment **)
            &puVar3[uVar1]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
      uVar8 = *mem;
      uVar9 = mem[1];
      uVar10 = mem[2];
      uVar11 = mem[3];
    }
    *(undefined4 *)&(_Var7._M_head_impl)->memory = uVar8;
    *(undefined4 *)((long)&(_Var7._M_head_impl)->memory + 4) = uVar9;
    *(undefined4 *)((long)&(_Var7._M_head_impl)->memory + 8) = uVar10;
    *(undefined4 *)((long)&(_Var7._M_head_impl)->memory + 0xc) = uVar11;
  }
  else {
    *(undefined1 *)
     ((long)_Var4._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x28) = 1;
  }
  __return_storage_ptr__[0x20] = (_Variant_storage<false,wasm::Ok,wasm::Err>)0x0;
  return (Result<wasm::Ok> *)__return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addData(
  Name, Name* mem, std::optional<ExprT> offset, DataStringT, Index pos) {
  auto& d = wasm.dataSegments[index];
  if (offset) {
    d->isPassive = false;
    d->offset = *offset;
    if (mem) {
      d->memory = *mem;
    } else if (wasm.memories.size() > 0) {
      d->memory = wasm.memories[0]->name;
    } else {
      return in.err(pos, "active data segment with no memory");
    }
  } else {
    d->isPassive = true;
  }
  return Ok{};
}